

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_read_open2.c
# Opt level: O0

void test_archive_read_open2(void)

{
  char *no_formats;
  char *no_reader;
  archive_skip_callback *in_stack_00000018;
  archive_read_callback *in_stack_00000020;
  undefined1 *in_stack_00000028;
  int in_stack_00000034;
  char *in_stack_00000040;
  
  test(in_stack_00000034,in_stack_00000028,in_stack_00000020,in_stack_00000018,no_reader,
       no_formats._4_4_,in_stack_00000040);
  test(in_stack_00000034,in_stack_00000028,in_stack_00000020,in_stack_00000018,no_reader,
       no_formats._4_4_,in_stack_00000040);
  test(in_stack_00000034,in_stack_00000028,in_stack_00000020,in_stack_00000018,no_reader,
       no_formats._4_4_,in_stack_00000040);
  test(in_stack_00000034,in_stack_00000028,in_stack_00000020,in_stack_00000018,no_reader,
       no_formats._4_4_,in_stack_00000040);
  test(in_stack_00000034,in_stack_00000028,in_stack_00000020,in_stack_00000018,no_reader,
       no_formats._4_4_,in_stack_00000040);
  test(in_stack_00000034,in_stack_00000028,in_stack_00000020,in_stack_00000018,no_reader,
       no_formats._4_4_,in_stack_00000040);
  test(in_stack_00000034,in_stack_00000028,in_stack_00000020,in_stack_00000018,no_reader,
       no_formats._4_4_,in_stack_00000040);
  test(in_stack_00000034,in_stack_00000028,in_stack_00000020,in_stack_00000018,no_reader,
       no_formats._4_4_,in_stack_00000040);
  test(in_stack_00000034,in_stack_00000028,in_stack_00000020,in_stack_00000018,no_reader,
       no_formats._4_4_,in_stack_00000040);
  test(in_stack_00000034,in_stack_00000028,in_stack_00000020,in_stack_00000018,no_reader,
       no_formats._4_4_,in_stack_00000040);
  test(in_stack_00000034,in_stack_00000028,in_stack_00000020,in_stack_00000018,no_reader,
       no_formats._4_4_,in_stack_00000040);
  test(in_stack_00000034,in_stack_00000028,in_stack_00000020,in_stack_00000018,no_reader,
       no_formats._4_4_,in_stack_00000040);
  test(in_stack_00000034,in_stack_00000028,in_stack_00000020,in_stack_00000018,no_reader,
       no_formats._4_4_,in_stack_00000040);
  test(in_stack_00000034,in_stack_00000028,in_stack_00000020,in_stack_00000018,no_reader,
       no_formats._4_4_,in_stack_00000040);
  return;
}

Assistant:

DEFINE_TEST(test_archive_read_open2)
{
	const char *no_reader =
	    "No reader function provided to archive_read_open";
	const char *no_formats = "No formats registered";

	test(1, NULL, NULL, NULL, NULL,
	    ARCHIVE_FATAL, no_reader);
	test(1, open_cb, NULL, NULL, NULL,
	    ARCHIVE_FATAL, no_reader);
	test(1, open_cb, read_cb, NULL, NULL,
	    ARCHIVE_OK, NULL);
	test(1, open_cb, read_cb, skip_cb, NULL,
	    ARCHIVE_OK, NULL);
	test(1, open_cb, read_cb, skip_cb, close_cb,
	    ARCHIVE_OK, NULL);
	test(1, NULL, read_cb, skip_cb, close_cb,
	    ARCHIVE_OK, NULL);
	test(1, open_cb, read_cb, skip_cb, NULL,
	    ARCHIVE_OK, NULL);
	test(1, NULL, read_cb, skip_cb, NULL,
	    ARCHIVE_OK, NULL);
	test(1, NULL, read_cb, NULL, NULL,
	    ARCHIVE_OK, NULL);

	test(0, NULL, NULL, NULL, NULL,
	    ARCHIVE_FATAL, no_reader);
	test(0, open_cb, NULL, NULL, NULL,
	    ARCHIVE_FATAL, no_reader);
	test(0, open_cb, read_cb, NULL, NULL,
	    ARCHIVE_FATAL, no_formats);
	test(0, open_cb, read_cb, skip_cb, NULL,
	    ARCHIVE_FATAL, no_formats);
	test(0, open_cb, read_cb, skip_cb, close_cb,
	    ARCHIVE_FATAL, no_formats);
}